

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libmeshb7.c
# Opt level: O0

int GmfSetHONodesOrdering(int64_t MshIdx,int KwdCod,int *BasTab,int *OrdTab)

{
  long lVar1;
  bool bVar2;
  void *pvVar3;
  long in_RCX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  KwdSct *kwd;
  GmfMshSct *msh;
  int NmbCrd;
  int NmbNod;
  int flg;
  int k;
  int j;
  int i;
  int local_40;
  int local_3c;
  int local_34;
  int local_30;
  int local_2c;
  int local_4;
  
  if ((in_ESI < 1) || (0xf0 < in_ESI)) {
    local_4 = 0;
  }
  else {
    lVar1 = in_RDI + 0x110 + (long)in_ESI * 0x3300;
    switch(in_ESI) {
    case 5:
      local_3c = 2;
      local_40 = 1;
      break;
    case 6:
      local_3c = 3;
      local_40 = 3;
      break;
    case 7:
      local_3c = 4;
      local_40 = 2;
      break;
    case 8:
      local_3c = 4;
      local_40 = 4;
      break;
    case 9:
      local_3c = 6;
      local_40 = 4;
      break;
    case 10:
      local_3c = 8;
      local_40 = 3;
      break;
    default:
      return 0;
    case 0x18:
      local_3c = 6;
      local_40 = 3;
      break;
    case 0x19:
      local_3c = 3;
      local_40 = 1;
      break;
    case 0x1b:
      local_3c = 9;
      local_40 = 2;
      break;
    case 0x1e:
      local_3c = 10;
      local_40 = 4;
      break;
    case 0x21:
      local_3c = 0x1b;
      local_40 = 3;
      break;
    case 0x31:
      local_3c = 5;
      local_40 = 3;
      break;
    case 0x56:
      local_3c = 0x12;
      local_40 = 4;
      break;
    case 0x57:
      local_3c = 0xe;
      local_40 = 3;
      break;
    case 0x58:
      local_3c = 0x10;
      local_40 = 2;
      break;
    case 0x59:
      local_3c = 0x19;
      local_40 = 2;
      break;
    case 0x5a:
      local_3c = 10;
      local_40 = 3;
      break;
    case 0x5b:
      local_3c = 0xf;
      local_40 = 3;
      break;
    case 0x5c:
      local_3c = 4;
      local_40 = 1;
      break;
    case 0x5d:
      local_3c = 5;
      local_40 = 1;
      break;
    case 0x60:
      local_3c = 0x14;
      local_40 = 4;
      break;
    case 0x61:
      local_3c = 0x23;
      local_40 = 4;
      break;
    case 0x62:
      local_3c = 0x40;
      local_40 = 3;
      break;
    case 99:
      local_3c = 0x7d;
      local_40 = 3;
      break;
    case 100:
      local_3c = 0x1e;
      local_40 = 3;
      break;
    case 0x65:
      local_3c = 0x37;
      local_40 = 3;
      break;
    case 0x66:
      local_3c = 0x28;
      local_40 = 4;
      break;
    case 0x67:
      local_3c = 0x4b;
      local_40 = 4;
    }
    if (*(long *)(lVar1 + 0xfb8) != 0) {
      free(*(void **)(lVar1 + 0xfb8));
    }
    pvVar3 = malloc((long)local_3c << 2);
    *(void **)(lVar1 + 0xfb8) = pvVar3;
    if (pvVar3 == (void *)0x0) {
      local_4 = 0;
    }
    else {
      for (local_2c = 0; local_2c < local_3c; local_2c = local_2c + 1) {
        for (local_30 = 0; local_30 < local_3c; local_30 = local_30 + 1) {
          bVar2 = true;
          for (local_34 = 0; local_34 < local_40; local_34 = local_34 + 1) {
            if (*(int *)(in_RDX + (long)(local_2c * local_40 + local_34) * 4) !=
                *(int *)(in_RCX + (long)(local_30 * local_40 + local_34) * 4)) {
              bVar2 = false;
              break;
            }
          }
          if (bVar2) {
            *(int *)(*(long *)(lVar1 + 0xfb8) + (long)local_30 * 4) = local_2c;
          }
        }
      }
      for (local_2c = 0; local_2c < local_3c; local_2c = local_2c + 1) {
        bVar2 = false;
        for (local_30 = 0; local_30 < local_3c; local_30 = local_30 + 1) {
          if (*(int *)(*(long *)(lVar1 + 0xfb8) + (long)local_30 * 4) == local_2c) {
            bVar2 = true;
            break;
          }
        }
        if (!bVar2) {
          for (local_30 = 0; local_30 < local_3c; local_30 = local_30 + 1) {
            *(int *)(*(long *)(lVar1 + 0xfb8) + (long)local_30 * 4) = local_30;
          }
          return 0;
        }
      }
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int GmfSetHONodesOrdering(int64_t MshIdx, int KwdCod, int *BasTab, int *OrdTab)
{
   int i, j, k, flg, NmbNod, NmbCrd;
   GmfMshSct   *msh = (GmfMshSct *)MshIdx;
   KwdSct      *kwd;
   
   if( (KwdCod < 1) || (KwdCod > GmfMaxKwd) )
      return(0);

   kwd = &msh->KwdTab[ KwdCod ];

   // Find the Bezier indices dimension according to the element's kind
   switch(KwdCod)
   {
      case GmfEdges   :          NmbNod =  2; NmbCrd = 1; break;
      case GmfEdgesP2 :          NmbNod =  3; NmbCrd = 1; break;
      case GmfEdgesP3 :          NmbNod =  4; NmbCrd = 1; break;
      case GmfEdgesP4 :          NmbNod =  5; NmbCrd = 1; break;
      case GmfTriangles   :      NmbNod =  3; NmbCrd = 3; break;
      case GmfTrianglesP2 :      NmbNod =  6; NmbCrd = 3; break;
      case GmfTrianglesP3 :      NmbNod = 10; NmbCrd = 3; break;
      case GmfTrianglesP4 :      NmbNod = 15; NmbCrd = 3; break;
      case GmfQuadrilaterals   : NmbNod =  4; NmbCrd = 2; break;
      case GmfQuadrilateralsQ2 : NmbNod =  9; NmbCrd = 2; break;
      case GmfQuadrilateralsQ3 : NmbNod = 16; NmbCrd = 2; break;
      case GmfQuadrilateralsQ4 : NmbNod = 25; NmbCrd = 2; break;
      case GmfTetrahedra   :     NmbNod =  4; NmbCrd = 4; break;
      case GmfTetrahedraP2 :     NmbNod = 10; NmbCrd = 4; break;
      case GmfTetrahedraP3 :     NmbNod = 20; NmbCrd = 4; break;
      case GmfTetrahedraP4 :     NmbNod = 35; NmbCrd = 4; break;
      case GmfPyramids   :       NmbNod =  5; NmbCrd = 3; break;
      case GmfPyramidsP2 :       NmbNod = 14; NmbCrd = 3; break;
      case GmfPyramidsP3 :       NmbNod = 30; NmbCrd = 3; break;
      case GmfPyramidsP4 :       NmbNod = 55; NmbCrd = 3; break;
      case GmfPrisms   :         NmbNod =  6; NmbCrd = 4; break;
      case GmfPrismsP2 :         NmbNod = 18; NmbCrd = 4; break;
      case GmfPrismsP3 :         NmbNod = 40; NmbCrd = 4; break;
      case GmfPrismsP4 :         NmbNod = 75; NmbCrd = 4; break;
      case GmfHexahedra   :      NmbNod =  8; NmbCrd = 3; break;
      case GmfHexahedraQ2 :      NmbNod = 27; NmbCrd = 3; break;
      case GmfHexahedraQ3 :      NmbNod = 64; NmbCrd = 3; break;
      case GmfHexahedraQ4 :      NmbNod =125; NmbCrd = 3; break;
      default : return(0);
   }

   // Free and rebuild the mapping table if there were already one
   if(kwd->OrdTab)
      free(kwd->OrdTab);

   if(!(kwd->OrdTab = malloc(NmbNod * sizeof(int))))
      return(0);

   // Find the corresponding Bezier coordinates from the source table
   for(i=0;i<NmbNod;i++)
   {
      for(j=0;j<NmbNod;j++)
      {
         flg = 1;

         for(k=0;k<NmbCrd;k++)
            if(BasTab[ i * NmbCrd + k ] != OrdTab[ j * NmbCrd + k ])
            {
               flg = 0;
               break;
            }

         if(flg)
            kwd->OrdTab[j] = i;
      }
   }

   // Check the ordering consistency
   for(i=0;i<NmbNod;i++)
   {
      flg = 0;

      for(j=0;j<NmbNod;j++)
         if(kwd->OrdTab[j] == i)
         {
            flg = 1;
            break;
         }

      if(!flg)
      {
         for(j=0;j<NmbNod;j++)
            kwd->OrdTab[j] = j;

         return(0);
      }
   }

   return(1);
}